

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O1

DdNode * Abc_NtkSparsifyInternalOne(DdManager *ddNew,DdNode *bFunc,int nFanins,int nPerc)

{
  uint uVar1;
  DdNode **pbCubes;
  DdNode *n;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  dVar4 = Cudd_CountMinterm(ddNew,bFunc,nFanins);
  uVar1 = (uint)((double)(int)dVar4 * (double)nPerc * 0.01);
  uVar3 = 1;
  if (1 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  pbCubes = Cudd_bddPickArbitraryMinterms(ddNew,bFunc,ddNew->vars,nFanins,(int)uVar3);
  uVar2 = 0;
  do {
    Cudd_Ref(pbCubes[uVar2]);
    uVar2 = uVar2 + 1;
  } while (uVar3 != uVar2);
  n = Extra_bddComputeSum(ddNew,pbCubes,(int)uVar3);
  Cudd_Ref(n);
  uVar2 = 0;
  do {
    Cudd_RecursiveDeref(ddNew,pbCubes[uVar2]);
    uVar2 = uVar2 + 1;
  } while (uVar3 != uVar2);
  Cudd_Deref(n);
  if (pbCubes != (DdNode **)0x0) {
    free(pbCubes);
  }
  return n;
}

Assistant:

DdNode * Abc_NtkSparsifyInternalOne( DdManager * ddNew, DdNode * bFunc, int nFanins, int nPerc )
{
    int nSpace = (int)Cudd_CountMinterm( ddNew, bFunc, nFanins );
    int i, nMints = Abc_MaxInt( 1, (int)(0.01 * nPerc * nSpace) );
    DdNode ** pbMints = Cudd_bddPickArbitraryMinterms( ddNew, bFunc, ddNew->vars, nFanins, nMints );
    DdNode * bRes;
    for ( i = 0; i < nMints; i++ )
        Cudd_Ref( pbMints[i] );
    bRes = Extra_bddComputeSum( ddNew, pbMints, nMints ); Cudd_Ref( bRes );
    for ( i = 0; i < nMints; i++ )
        Cudd_RecursiveDeref( ddNew, pbMints[i] );
    Cudd_Deref( bRes );
    ABC_FREE( pbMints );
    return bRes;
}